

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

int __thiscall
flow::RegExpGroupInstr::clone
          (RegExpGroupInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConstantInt *local_28;
  unique_ptr<flow::RegExpGroupInstr,_std::default_delete<flow::RegExpGroupInstr>_> local_20;
  undefined1 local_18 [8];
  RegExpGroupInstr *this_local;
  
  local_18 = (undefined1  [8])__fn;
  this_local = this;
  local_28 = groupId((RegExpGroupInstr *)__fn);
  Value::name_abi_cxx11_((Value *)__fn);
  std::
  make_unique<flow::RegExpGroupInstr,flow::ConstantValue<long,(flow::LiteralType)2>*,std::__cxx11::string_const&>
            ((ConstantValue<long,_(flow::LiteralType)2> **)&local_20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::RegExpGroupInstr,std::default_delete<flow::RegExpGroupInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)this,&local_20);
  std::unique_ptr<flow::RegExpGroupInstr,_std::default_delete<flow::RegExpGroupInstr>_>::~unique_ptr
            (&local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> RegExpGroupInstr::clone() {
  return std::make_unique<RegExpGroupInstr>(groupId(), name());
}